

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O0

char * skynet_socket_udp_address(skynet_socket_message *msg,int *addrsz)

{
  undefined1 local_40 [8];
  socket_message sm;
  int *addrsz_local;
  skynet_socket_message *msg_local;
  
  if (msg->type == 6) {
    local_40._0_4_ = msg->id;
    sm.id = 0;
    sm._4_4_ = 0;
    sm.opaque._0_4_ = msg->ud;
    sm._16_8_ = msg->buffer;
    sm.data = (char *)addrsz;
    msg_local = (skynet_socket_message *)
                socket_server_udp_address(SOCKET_SERVER,(socket_message *)local_40,addrsz);
  }
  else {
    msg_local = (skynet_socket_message *)0x0;
  }
  return (char *)msg_local;
}

Assistant:

const char *
skynet_socket_udp_address(struct skynet_socket_message *msg, int *addrsz) {
	if (msg->type != SKYNET_SOCKET_TYPE_UDP) {
		return NULL;
	}
	struct socket_message sm;
	sm.id = msg->id;
	sm.opaque = 0;
	sm.ud = msg->ud;
	sm.data = msg->buffer;
	return (const char *)socket_server_udp_address(SOCKET_SERVER, &sm, addrsz);
}